

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>,_bool>
* __thiscall
absl::lts_20250127::container_internal::
btree<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>
::insert_unique<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>
          (pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>,_bool>
           *__return_storage_ptr__,
          btree<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>
          *this,int *key,pair<const_int,_google::protobuf::internal::ExtensionSet::Extension> *args)

{
  btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
  *pbVar1;
  bool bVar2;
  SearchResult<unsigned_long,_false> SVar3;
  btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
  *this_00;
  btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
  *pbVar4;
  uint uVar5;
  ulong uVar6;
  iterator iVar7;
  
  if (*(long *)(this + 0x10) == 0) {
    this_00 = (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
               *)Allocate<8ul,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                           ((allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                             *)(this + 8),0x30);
    btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
    ::init_leaf(this_00,'\0','\x01',this_00);
    *(btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
      **)(this + 8) = this_00;
    *(btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
      **)this = this_00;
  }
  else {
    this_00 = *(btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                **)this;
  }
  btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
  ::start(this_00);
  for (; SVar3 = btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>
                 ::
                 linear_search<int,absl::lts_20250127::container_internal::key_compare_adapter<std::less<int>,int>::checked_compare>
                           ((btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>
                             *)this_00,key,(checked_compare *)(this + 8)), ((ulong)this_00 & 7) == 0
      ; this_00 = btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                  ::child(this_00,(field_type)SVar3.value)) {
    if (this_00[0xb] !=
        (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
         )0x0) {
      uVar6 = SVar3.value & 0xffffffff;
      pbVar4 = this_00;
      goto LAB_001de8ac;
    }
  }
LAB_001de916:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<int, google::protobuf::internal::ExtensionSet::Extension, std::less<int>, std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<int, google::protobuf::internal::ExtensionSet::Extension>, absl::container_internal::btree_node<absl::container_internal::map_params<int, google::protobuf::internal::ExtensionSet::Extension, std::less<int>, std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 7, 8>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<int, google::protobuf::internal::ExtensionSet::Extension, std::less<int>, std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<int, google::protobuf::internal::ExtensionSet::Extension>, absl::container_internal::btree_node<absl::container_internal::map_params<int, google::protobuf::internal::ExtensionSet::Extension, std::less<int>, std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 7, 8>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
               );
LAB_001de8ac:
  uVar5 = (uint)uVar6;
  if (((ulong)pbVar4 & 7) != 0) goto LAB_001de916;
  if (uVar5 != (byte)pbVar4[10]) {
    if (*(int *)(pbVar4 + (long)(int)uVar5 * 0x20 + 0x10) <= *key) {
      bVar2 = false;
      goto LAB_001de8fb;
    }
    goto LAB_001de8e2;
  }
  pbVar1 = *(btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
             **)pbVar4;
  if (((ulong)pbVar1 & 7) != 0) goto LAB_001de916;
  uVar6 = (ulong)(byte)pbVar4[8];
  pbVar4 = pbVar1;
  if (pbVar1[0xb] !=
      (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
       )0x0) {
LAB_001de8e2:
    iVar7._8_8_ = SVar3.value & 0xffffffff;
    iVar7.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                   *)this_00;
    iVar7 = internal_emplace<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>
                      (this,iVar7,args);
    uVar5 = iVar7.position_;
    pbVar4 = (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
              *)iVar7.node_;
    bVar2 = true;
LAB_001de8fb:
    (__return_storage_ptr__->first).node_ = pbVar4;
    (__return_storage_ptr__->first).position_ = uVar5;
    __return_storage_ptr__->second = bVar2;
    return __return_storage_ptr__;
  }
  goto LAB_001de8ac;
}

Assistant:

auto btree<P>::insert_unique(const K &key, Args &&...args)
    -> std::pair<iterator, bool> {
  if (empty()) {
    mutable_root() = mutable_rightmost() = new_leaf_root_node(1);
  }

  SearchResult<iterator, is_key_compare_to::value> res = internal_locate(key);
  iterator iter = res.value;

  if (res.HasMatch()) {
    if (res.IsEq()) {
      // The key already exists in the tree, do nothing.
      return {iter, false};
    }
  } else {
    iterator last = internal_last(iter);
    if (last.node_ && !compare_keys(key, last.key())) {
      // The key already exists in the tree, do nothing.
      return {last, false};
    }
  }
  return {internal_emplace(iter, std::forward<Args>(args)...), true};
}